

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

float __thiscall Imath_3_2::Matrix33<float>::determinant(Matrix33<float> *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar1 = this->x[1][0];
  fVar2 = this->x[1][1];
  fVar3 = this->x[2][2];
  fVar4 = this->x[1][2];
  fVar5 = this->x[2][1];
  fVar6 = this->x[2][0];
  return (fVar1 * fVar5 - fVar6 * fVar2) * this->x[0][2] +
         (fVar2 * fVar3 - fVar5 * fVar4) * this->x[0][0] +
         (fVar4 * fVar6 - fVar3 * fVar1) * this->x[0][1];
}

Assistant:

IMATH_HOSTDEVICE constexpr inline T
Matrix33<T>::determinant () const IMATH_NOEXCEPT
{
    return x[0][0] * (x[1][1] * x[2][2] - x[1][2] * x[2][1]) +
           x[0][1] * (x[1][2] * x[2][0] - x[1][0] * x[2][2]) +
           x[0][2] * (x[1][0] * x[2][1] - x[1][1] * x[2][0]);
}